

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.cpp
# Opt level: O2

FUNCTION_RETURN
license::os::getAdapterInfos
          (vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>
           *adapterInfos)

{
  ushort uVar1;
  sockaddr *psVar2;
  int iVar3;
  size_t sVar4;
  iterator iVar5;
  mapped_type *__dest;
  int *piVar6;
  char *pcVar7;
  FUNCTION_RETURN FVar8;
  __node_base *p_Var9;
  long lVar10;
  uint uVar11;
  ifaddrs *piVar12;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar13;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 uVar14;
  ifaddrs *ifaddr;
  string if_name;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>_>
  adapterByName;
  OsAdapterInfo newAdapter;
  
  adapterByName._M_h._M_buckets = &adapterByName._M_h._M_single_bucket;
  adapterByName._M_h._M_bucket_count = 1;
  adapterByName._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  adapterByName._M_h._M_element_count = 0;
  adapterByName._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  adapterByName._M_h._M_rehash_policy._M_next_resize = 0;
  adapterByName._M_h._M_single_bucket = (__node_base_ptr)0x0;
  piVar12 = (ifaddrs *)&ifaddr;
  iVar3 = getifaddrs(piVar12);
  if (iVar3 == -1) {
    piVar6 = __errno_location();
    uVar13 = extraout_XMM0_Da;
    uVar14 = extraout_XMM0_Db;
    if (*piVar6 != 0) {
      strerror(*piVar6);
      uVar13 = extraout_XMM0_Da_00;
      uVar14 = extraout_XMM0_Db_00;
    }
    _log((double)CONCAT44(uVar14,uVar13));
    FVar8 = FUNC_RET_ERROR;
LAB_00199b94:
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&adapterByName._M_h);
    return FVar8;
  }
  p_Var9 = &adapterByName._M_h._M_before_begin;
  do {
    do {
      piVar12 = piVar12->ifa_next;
      if (piVar12 == (ifaddrs *)0x0) {
        freeifaddrs(ifaddr);
        if (adapterByName._M_h._M_element_count == 0) {
          FVar8 = FUNC_RET_NOT_AVAIL;
        }
        else {
          std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
          reserve(adapterInfos,adapterByName._M_h._M_element_count);
          while (p_Var9 = p_Var9->_M_nxt, p_Var9 != (__node_base *)0x0) {
            std::vector<license::os::OsAdapterInfo,_std::allocator<license::os::OsAdapterInfo>_>::
            push_back(adapterInfos,(value_type *)(p_Var9 + 5));
          }
          FVar8 = FUNC_RET_OK;
        }
        goto LAB_00199b94;
      }
    } while ((piVar12->ifa_addr == (sockaddr *)0x0) || ((piVar12->ifa_flags & 8) != 0));
    pcVar7 = piVar12->ifa_name;
    sVar4 = mstrnlen_s(pcVar7,0x401);
    if_name._M_dataplus._M_p = (pointer)&if_name.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&if_name,pcVar7,pcVar7 + sVar4);
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&adapterByName._M_h,&if_name);
    if (iVar5.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
        ._M_cur == (__node_type *)0x0) {
      memset(&newAdapter,0,0x414);
      mstrlcpy(newAdapter.description,piVar12->ifa_name,0x401);
      __dest = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&adapterByName._M_h,&if_name);
      memcpy(__dest,&newAdapter,0x414);
    }
    iVar5 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&adapterByName._M_h,&if_name);
    uVar1 = piVar12->ifa_addr->sa_family;
    pcVar7 = "AF_PACKET";
    uVar11 = (uint)uVar1;
    if (((uVar1 != 0x11) && (pcVar7 = "AF_INET", uVar1 != 2)) && (pcVar7 = "???", uVar11 == 10)) {
      pcVar7 = "AF_INET6";
    }
    printf("%-8s %s (%d)\n",piVar12->ifa_name,pcVar7,(ulong)uVar11);
    if (uVar11 == 2) {
      *(undefined4 *)
       ((long)iVar5.
              super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
              ._M_cur + 0x434) = *(undefined4 *)(piVar12->ifa_addr->sa_data + 2);
    }
    else if ((uVar11 == 0x11) && (piVar12->ifa_data != (void *)0x0)) {
      psVar2 = piVar12->ifa_addr;
      for (lVar10 = 0; lVar10 != 6; lVar10 = lVar10 + 1) {
        *(char *)((long)iVar5.
                        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_license::os::OsAdapterInfo>,_true>
                        ._M_cur + 0x42e + lVar10) = psVar2->sa_data[lVar10 + 10];
        printf("%02x:");
      }
      printf("\t %s\n",piVar12->ifa_name);
    }
    std::__cxx11::string::~string((string *)&if_name);
  } while( true );
}

Assistant:

FUNCTION_RETURN getAdapterInfos(vector<OsAdapterInfo> &adapterInfos) {
	unordered_map<string, OsAdapterInfo> adapterByName;

	FUNCTION_RETURN f_return = FUNC_RET_OK;
	struct ifaddrs *ifaddr, *ifa;
	int family, n = 0;
	unsigned int if_num, if_max;

	if (getifaddrs(&ifaddr) == -1) {
		LOG_WARN("getifaddrs failed == -1");
		return FUNC_RET_ERROR;
	}

	for (ifa = ifaddr, n = 0, if_num = 0; ifa != NULL; ifa = ifa->ifa_next, n++) {
		if (ifa->ifa_addr == NULL || (ifa->ifa_flags & IFF_LOOPBACK) != 0) {
			continue;
		}
		string if_name(ifa->ifa_name, mstrnlen_s(ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN));
		// if_name_position = ifname_position(ifnames, ifa->ifa_name, if_num);
		// interface name not seen en advance
		OsAdapterInfo *currentAdapter;
		if (adapterByName.find(if_name) == adapterByName.end()) {
			OsAdapterInfo newAdapter;
			memset(&newAdapter, 0, sizeof(OsAdapterInfo));
			mstrlcpy(&newAdapter.description[0], ifa->ifa_name, LCC_ADAPTER_DESCRIPTION_LEN);
			adapterByName[if_name] = newAdapter;
		}
		auto it = adapterByName.find(if_name);
		currentAdapter = &it->second;
		family = ifa->ifa_addr->sa_family;
		/* Display interface name and family (including symbolic
		 form of the latter for the common families) */
#ifndef NDEBUG
		printf("%-8s %s (%d)\n", ifa->ifa_name,
			   (family == AF_PACKET) ? "AF_PACKET"
									 : (family == AF_INET) ? "AF_INET" : (family == AF_INET6) ? "AF_INET6" : "???",
			   family);
#endif
		/* For an AF_INET* interface address, display the address
		 * || family == AF_INET6*/
		if (family == AF_INET) {
			struct sockaddr_in *s1 = (struct sockaddr_in *)ifa->ifa_addr;
			in_addr_t iaddr = s1->sin_addr.s_addr;
			currentAdapter->ipv4_address[0] = (iaddr & 0x000000ff);
			currentAdapter->ipv4_address[1] = (iaddr & 0x0000ff00) >> 8;
			currentAdapter->ipv4_address[2] = (iaddr & 0x00ff0000) >> 16;
			currentAdapter->ipv4_address[3] = (iaddr & 0xff000000) >> 24;

		} else if (family == AF_PACKET && ifa->ifa_data != NULL) {
			struct sockaddr_ll *s1 = (struct sockaddr_ll *)ifa->ifa_addr;
			int i;
			for (i = 0; i < 6; i++) {
				currentAdapter->mac_address[i] = s1->sll_addr[i];
#ifndef NDEBUG
				printf("%02x:", s1->sll_addr[i]);
#endif
			}
#ifndef NDEBUG
			printf("\t %s\n", ifa->ifa_name);
#endif
		}
	}
	freeifaddrs(ifaddr);

	// FIXME sort by eth , enps, wlan
	if (adapterByName.size() == 0) {
		f_return = FUNC_RET_NOT_AVAIL;
	} else {
		f_return = FUNC_RET_OK;
		adapterInfos.reserve(adapterByName.size());
		for (auto &it : adapterByName) {
			adapterInfos.push_back(it.second);
		}
	}
	return f_return;
}